

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationProblem.cpp
# Opt level: O2

void __thiscall
iDynTree::optimization::OptimizationProblem::OptimizationProblem(OptimizationProblem *this)

{
  OptimizationProblemInfoData *this_00;
  __shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  this->_vptr_OptimizationProblem = (_func_int **)&PTR__OptimizationProblem_001d45a0;
  this_00 = (OptimizationProblemInfoData *)operator_new(8);
  OptimizationProblemInfoData::OptimizationProblemInfoData(this_00);
  std::__shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,void>
            ((__shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,(__gnu_cxx::_Lock_policy)2>
              *)&this->m_infoData,this_00);
  std::__shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_30,
                 &(this->m_infoData).
                  super___shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,_(__gnu_cxx::_Lock_policy)2>
                );
  OptimizationProblemInfo::OptimizationProblemInfo
            (&this->m_info,
             (shared_ptr<iDynTree::optimization::OptimizationProblemInfoData> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

OptimizationProblem::OptimizationProblem()
        :m_infoData(new OptimizationProblemInfoData)
        ,m_info(m_infoData)
        {
        }